

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::DrawBuffersIndexedTest::iterate
          (DrawBuffersIndexedTest *this)

{
  TestLog *log;
  ResultCollector results;
  allocator<char> local_81;
  string local_80;
  ResultCollector local_60;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,glcts::fixed_sample_locations_values + 1,&local_81);
  tcu::ResultCollector::ResultCollector(&local_60,log,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  anon_unknown_0::runTest
            (log,&local_60,((this->super_TestCase).m_context)->m_renderCtx,
             &this->m_preCommonBlendState,&this->m_postCommonBlendState,&this->m_drawBuffers);
  tcu::ResultCollector::setTestContextResult
            (&local_60,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&local_60);
  return STOP;
}

Assistant:

TestCase::IterateResult DrawBuffersIndexedTest::iterate (void)
{
	TestLog&				log		= m_testCtx.getLog();
	tcu::ResultCollector	results	(log);

	runTest(log, results, m_context.getRenderContext(), m_preCommonBlendState, m_postCommonBlendState, m_drawBuffers);

	results.setTestContextResult(m_testCtx);

	return STOP;
}